

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O3

bool process_arguments(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  string *psVar7;
  char *pcVar8;
  int iVar9;
  char *__s;
  
  if (1 < argc) {
    iVar9 = 1;
    do {
      sVar3 = config_filename_abi_cxx11_._M_string_length;
      pcVar8 = (char *)interface_name_abi_cxx11_._M_string_length;
      sVar2 = default_filename_abi_cxx11_._M_string_length;
      __s2 = (byte *)argv[iVar9];
      bVar1 = *__s2;
      iVar4 = -(bVar1 - 0x2d);
      iVar6 = iVar4;
      if (bVar1 == 0x2d) {
        uVar5 = __s2[1] - 99;
        if (uVar5 == 0) {
          uVar5 = (uint)__s2[2];
        }
        iVar6 = -uVar5;
      }
      if ((iVar6 == 0) && (iVar9 + 1 < argc)) {
        __s = argv[iVar9 + 1];
        strlen(__s);
        psVar7 = &config_filename_abi_cxx11_;
        pcVar8 = (char *)sVar3;
LAB_00105d95:
        iVar9 = iVar9 + 1;
        std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar8,(ulong)__s);
      }
      else {
        iVar6 = iVar4;
        if (bVar1 != 0x2d) {
LAB_00105cd1:
          if ((iVar6 == 0) && (iVar9 + 1 < argc)) {
            __s = argv[iVar9 + 1];
            strlen(__s);
            psVar7 = &default_filename_abi_cxx11_;
            pcVar8 = (char *)sVar2;
          }
          else {
            iVar6 = iVar4;
            if (bVar1 == 0x2d) {
              uVar5 = __s2[1] - 0x69;
              if (uVar5 == 0) {
                uVar5 = (uint)__s2[2];
              }
              iVar6 = -uVar5;
            }
            if ((iVar6 != 0) || (argc <= iVar9 + 1)) {
              if (bVar1 == 0x2d) {
                uVar5 = __s2[1] - 0x6c;
                if (uVar5 == 0) {
                  uVar5 = (uint)__s2[2];
                }
                iVar4 = -uVar5;
              }
              if ((iVar4 != 0) || (argc <= iVar9 + 1)) {
                iVar6 = strcmp("--pidfile",(char *)__s2);
                pcVar8 = (char *)pid_filename_abi_cxx11_._M_string_length;
                if ((iVar6 != 0) || (argc <= iVar9 + 1)) goto LAB_00105db1;
                __s = argv[iVar9 + 1];
                strlen(__s);
                psVar7 = &pid_filename_abi_cxx11_;
                goto LAB_00105d95;
              }
            }
            __s = argv[iVar9 + 1];
            strlen(__s);
            psVar7 = &interface_name_abi_cxx11_;
          }
          goto LAB_00105d95;
        }
        uVar5 = __s2[1] - 0x44;
        if (uVar5 == 0) {
          uVar5 = (uint)__s2[2];
        }
        if (uVar5 != 0) {
          uVar5 = __s2[1] - 100;
          if (uVar5 == 0) {
            uVar5 = (uint)__s2[2];
          }
          iVar6 = -uVar5;
          goto LAB_00105cd1;
        }
        daemonize = true;
      }
LAB_00105db1:
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  return true;
}

Assistant:

bool process_arguments(int argc, char** argv)
{
  // Loop over all the arguments, and process them
  for (int arg = 1; arg < argc; arg++)
  {
    // Argument -c specifies the config file filename
    if (strcmp("-c", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      config_filename = argv[arg];
    }
    // Argument -D indicates this process should daemonize itself
    else if (strcmp("-D", argv[arg]) == 0)
    {
      daemonize = true;
    }
    // Argument -d specifies the default file filename
    else if (strcmp("-d", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      default_filename = argv[arg];
    }
    // Argument -i specifies an interface to monitor
    else if (strcmp("-i", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    // Argument -l specifies the log file filename
    else if (strcmp("-l", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    else if (strcmp("--pidfile", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      pid_filename = argv[arg];
    }

  }

  // If execution reaches here there was an acceptable set of arguments provided
  return true;
}